

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O0

double term(void)

{
  bool bVar1;
  double dVar2;
  Token local_e8;
  allocator<char> local_b1;
  string local_b0;
  double local_90;
  double d_1;
  string local_80;
  double local_60;
  double d;
  undefined1 local_48 [8];
  Token t;
  double left;
  
  t.name.field_2._8_8_ = primary();
  do {
    Token_stream::get((Token *)local_48,&ts);
    if (local_48[0] == '%') {
      local_90 = primary();
      if ((local_90 == 0.0) && (!NAN(local_90))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"divide by zero",&local_b1);
        error(&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
      t.name.field_2._8_8_ = (size_type)fmod(t.name.field_2._8_8_,local_90);
LAB_0010511f:
      bVar1 = false;
    }
    else {
      if (local_48[0] == '*') {
        dVar2 = primary();
        t.name.field_2._8_8_ = (size_type)(dVar2 * t.name.field_2._8_8_);
        goto LAB_0010511f;
      }
      if (local_48[0] == '/') {
        local_60 = primary();
        if ((local_60 == 0.0) && (!NAN(local_60))) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"divide by zero",(allocator<char> *)((long)&d_1 + 7));
          error(&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::allocator<char>::~allocator((allocator<char> *)((long)&d_1 + 7));
        }
        t.name.field_2._8_8_ = (size_type)(t.name.field_2._8_8_ / local_60);
        goto LAB_0010511f;
      }
      Token::Token(&local_e8,(Token *)local_48);
      Token_stream::unget(&ts,&local_e8);
      Token::~Token(&local_e8);
      left = (double)t.name.field_2._8_8_;
      bVar1 = true;
    }
    Token::~Token((Token *)local_48);
    if (bVar1) {
      return left;
    }
  } while( true );
}

Assistant:

double term()
{
	double left = primary();
	while (true)
	{
		Token t = ts.get();
		switch (t.kind)
		{
		case '*':
			left *= primary();
			break;
		case '/':
		{
			double d = primary();
			if (d == 0) error("divide by zero");
			left /= d;
			break;
		}
		case '%':
		{
			auto d = primary();
			if (d == 0)
				error("divide by zero");
			left = fmod(left, d);
			break;
		}
		default:
			ts.unget(t);
			return left;
		}
	}
}